

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  pointer *pppcVar1;
  pointer *pppcVar2;
  bool bVar3;
  int iVar4;
  cmCommand *pcVar5;
  undefined4 extraout_var;
  cmake *pcVar6;
  char *pcVar7;
  bool bVar8;
  string error;
  cmMakefileCall stack_manager;
  allocator local_68 [32];
  string name;
  
  bVar3 = IsFunctionBlocked(this,lff,status);
  if (bVar3) {
    return true;
  }
  std::__cxx11::string::string((string *)&name,(string *)lff);
  cmMakefileCall::cmMakefileCall(&stack_manager,this,&lff->super_cmCommandContext,status);
  pcVar5 = cmState::GetCommand(this->GlobalGenerator->CMakeInstance->State,&name);
  if (pcVar5 == (cmCommand *)0x0) {
    bVar3 = cmSystemTools::GetFatalErrorOccured();
    bVar8 = true;
    if (!bVar3) {
      std::__cxx11::string::string((string *)&error,"Unknown CMake command \"",local_68);
      std::__cxx11::string::append((string *)&error);
      std::__cxx11::string::append((char *)&error);
      IssueMessage(this,FATAL_ERROR,&error,false);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)&error);
      bVar8 = false;
    }
    goto LAB_0033d8b6;
  }
  iVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[8])(pcVar5);
  pcVar5 = (cmCommand *)CONCAT44(extraout_var,iVar4);
  pcVar5->Makefile = this;
  if ((pcVar5->Enabled != true) || (bVar3 = cmSystemTools::GetFatalErrorOccured(), bVar3)) {
LAB_0033d6d3:
    bVar8 = true;
    if ((this->GlobalGenerator->CMakeInstance->CurrentWorkingMode == SCRIPT_MODE) &&
       (iVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[9])(pcVar5), (char)iVar4 == '\0')) {
      std::__cxx11::string::string((string *)&error,"Command ",local_68);
      (*(pcVar5->super_cmObject)._vptr_cmObject[0xb])(local_68,pcVar5);
      std::__cxx11::string::append((string *)&error);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::append((char *)&error);
      IssueMessage(this,FATAL_ERROR,&error,false);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)&error);
      goto LAB_0033d8ab;
    }
  }
  else {
    pcVar6 = this->GlobalGenerator->CMakeInstance;
    if (pcVar6->CurrentWorkingMode == SCRIPT_MODE) {
      iVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[9])(pcVar5);
      if ((char)iVar4 == '\0') goto LAB_0033d6d3;
      pcVar6 = this->GlobalGenerator->CMakeInstance;
    }
    if (pcVar6->Trace == true) {
      PrintCommandTrace(this,lff);
    }
    iVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[4])(pcVar5,&lff->Arguments,status);
    if (((char)iVar4 == '\0') || ((status->NestedError & 1U) != 0)) {
      if ((status->NestedError & 1U) == 0) {
        pcVar7 = cmCommand::GetError(pcVar5);
        std::__cxx11::string::string((string *)&error,pcVar7,local_68);
        IssueMessage(this,FATAL_ERROR,&error,false);
        std::__cxx11::string::~string((string *)&error);
      }
      if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
        cmSystemTools::s_FatalErrorOccured = true;
      }
LAB_0033d8ab:
      bVar8 = false;
    }
    else {
      iVar4 = (*(pcVar5->super_cmObject)._vptr_cmObject[7])(pcVar5);
      bVar8 = true;
      if ((char)iVar4 != '\0') {
        error._M_dataplus._M_p = (pointer)pcVar5;
        std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
                  ((vector<cmCommand*,std::allocator<cmCommand*>> *)&this->FinalPassCommands,
                   (cmCommand **)&error);
        bVar8 = true;
        goto LAB_0033d8b6;
      }
    }
  }
  (*(pcVar5->super_cmObject)._vptr_cmObject[1])(pcVar5);
LAB_0033d8b6:
  pppcVar1 = &((stack_manager.Makefile)->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppcVar1 = *pppcVar1 + -1;
  pppcVar2 = &((stack_manager.Makefile)->ContextStack).
              super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppcVar2 = *pppcVar2 + -1;
  std::__cxx11::string::~string((string *)&name);
  return bVar8;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus &status)
{
  bool result = true;

  // quick return if blocked
  if(this->IsFunctionBlocked(lff,status))
    {
    // No error.
    return result;
    }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if(cmCommand* proto = this->GetState()->GetCommand(name))
    {
    // Clone the prototype.
    cmsys::auto_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if(pcmd->GetEnabled() && !cmSystemTools::GetFatalErrorOccured()  &&
       (this->GetCMakeInstance()->GetWorkingMode() != cmake::SCRIPT_MODE
       || pcmd->IsScriptable()))

      {
      // if trace is enabled, print out invoke information
      if(this->GetCMakeInstance()->GetTrace())
        {
        this->PrintCommandTrace(lff);
        }
      // Try invoking the command.
      if(!pcmd->InvokeInitialPass(lff.Arguments,status) ||
         status.GetNestedError())
        {
        if(!status.GetNestedError())
          {
          // The command invocation requested that we report an error.
          this->IssueMessage(cmake::FATAL_ERROR, pcmd->GetError());
          }
        result = false;
        if ( this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE)
          {
          cmSystemTools::SetFatalErrorOccured();
          }
        }
      else if(pcmd->HasFinalPass())
        {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
        }
      }
    else if ( this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE
              && !pcmd->IsScriptable() )
      {
      std::string error = "Command ";
      error += pcmd->GetName();
      error += "() is not scriptable";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }
  else
    {
    if(!cmSystemTools::GetFatalErrorOccured())
      {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }

  return result;
}